

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-reader.cc
# Opt level: O0

Writer * mp::operator<<(Writer *w,NLHeader *h)

{
  BasicCStringRef<char> arg0;
  int *args_1;
  long in_RSI;
  Writer *in_RDI;
  int i;
  long in_stack_ffffffffffffff08;
  char value;
  BasicWriter<char> *in_stack_ffffffffffffff10;
  double in_stack_ffffffffffffff28;
  BasicWriter<char> *in_stack_ffffffffffffff30;
  undefined4 local_bc;
  Writer *args_1_00;
  Writer *args;
  Writer *this;
  BasicCStringRef<char> in_stack_ffffffffffffff60;
  BasicCStringRef<char> BVar1;
  BasicWriter<char> *in_stack_ffffffffffffff68;
  Writer *args_3;
  BasicCStringRef<char> in_stack_ffffffffffffff70;
  undefined6 in_stack_ffffffffffffff88;
  undefined1 uVar2;
  undefined1 uVar3;
  BasicCStringRef<char> in_stack_ffffffffffffff90;
  BasicCStringRef<char> in_stack_ffffffffffffff98;
  BasicCStringRef<char> in_stack_ffffffffffffffa0;
  BasicCStringRef<char> in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb4;
  BasicCStringRef<char> local_48;
  BasicCStringRef<char> in_stack_ffffffffffffffc0;
  BasicCStringRef<char> in_stack_ffffffffffffffc8;
  BasicCStringRef<char> local_28;
  BasicCStringRef<char> local_20;
  int local_14;
  long local_10;
  Writer *local_8;
  
  uVar2 = 0x62;
  uVar3 = 0x67;
  if (*(int *)(in_RSI + 0xa8) != 0) {
    uVar3 = 0x62;
  }
  local_10 = in_RSI;
  local_8 = in_RDI;
  fmt::BasicWriter<char>::operator<<
            (in_stack_ffffffffffffff10,(char)((ulong)in_stack_ffffffffffffff08 >> 0x38));
  fmt::BasicWriter<char>::operator<<
            (in_stack_ffffffffffffff10,(int)((ulong)in_stack_ffffffffffffff08 >> 0x20));
  for (local_14 = 0; value = (char)((ulong)in_stack_ffffffffffffff08 >> 0x38),
      local_14 < *(int *)(local_10 + 0xac); local_14 = local_14 + 1) {
    fmt::BasicWriter<char>::operator<<(in_stack_ffffffffffffff10,value);
    fmt::BasicWriter<char>::operator<<(in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
  }
  if (*(long *)(local_10 + 0xb8) == 3) {
    fmt::BasicWriter<char>::operator<<(in_stack_ffffffffffffff10,value);
    fmt::BasicWriter<char>::operator<<(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
  }
  fmt::BasicWriter<char>::operator<<
            (in_stack_ffffffffffffff10,(char)((ulong)in_stack_ffffffffffffff08 >> 0x38));
  args_1_00 = local_8;
  fmt::BasicCStringRef<char>::BasicCStringRef(&local_20," {} {} {} {} {} {}\n");
  BVar1.data_._4_4_ = in_stack_ffffffffffffffb4;
  BVar1.data_._0_4_ = in_stack_ffffffffffffffb0;
  fmt::BasicWriter<char>::write<int,int,int,int,int,int>
            ((BasicWriter<char> *)in_stack_ffffffffffffffa8.data_,BVar1,
             (int *)in_stack_ffffffffffffffa0.data_,(int *)in_stack_ffffffffffffff98.data_,
             (int *)in_stack_ffffffffffffff90.data_,
             (int *)CONCAT17(uVar3,CONCAT16(uVar2,in_stack_ffffffffffffff88)),
             (int *)in_stack_ffffffffffffffc0.data_,(int *)in_stack_ffffffffffffffc8.data_);
  args = local_8;
  fmt::BasicCStringRef<char>::BasicCStringRef(&local_28," {} {} {} {} {} {}\n");
  arg0.data_._4_4_ = in_stack_ffffffffffffffb4;
  arg0.data_._0_4_ = in_stack_ffffffffffffffb0;
  fmt::BasicWriter<char>::write<int,int,int,int,int,int>
            ((BasicWriter<char> *)in_stack_ffffffffffffffa8.data_,arg0,
             (int *)in_stack_ffffffffffffffa0.data_,(int *)in_stack_ffffffffffffff98.data_,
             (int *)in_stack_ffffffffffffff90.data_,
             (int *)CONCAT17(uVar3,CONCAT16(uVar2,in_stack_ffffffffffffff88)),
             (int *)in_stack_ffffffffffffffc0.data_,(int *)in_stack_ffffffffffffffc8.data_);
  this = local_8;
  fmt::BasicCStringRef<char>::BasicCStringRef
            ((BasicCStringRef<char> *)&stack0xffffffffffffffc8," {} {}\n");
  fmt::BasicWriter<char>::write<int,int>
            (this,in_stack_ffffffffffffff60,(int *)args,(int *)args_1_00);
  BVar1.data_ = (char *)local_8;
  fmt::BasicCStringRef<char>::BasicCStringRef
            ((BasicCStringRef<char> *)&stack0xffffffffffffffc0," {} {} {}\n");
  fmt::BasicWriter<char>::write<int,int,int>
            (in_stack_ffffffffffffff68,in_stack_ffffffffffffff70,(int *)BVar1.data_,(int *)this,
             (int *)args);
  args_3 = local_8;
  fmt::BasicCStringRef<char>::BasicCStringRef(&local_48," {} {} {} {}\n");
  args_1 = (int *)(local_10 + 0x60);
  if (*(int *)(local_10 + 0xa8) == 0) {
    local_bc = 0;
  }
  else {
    local_bc = *(undefined4 *)(local_10 + 0x108);
  }
  fmt::BasicWriter<char>::write<int,int,int,int>
            ((BasicWriter<char> *)CONCAT17(uVar3,CONCAT16(uVar2,in_stack_ffffffffffffff88)),
             in_stack_ffffffffffffff90,(int *)in_RDI,args_1,(int *)(local_10 + 0x5c),(int *)args_3);
  fmt::BasicCStringRef<char>::BasicCStringRef
            ((BasicCStringRef<char> *)&stack0xffffffffffffffa8," {} {} {} {} {}\n");
  fmt::BasicWriter<char>::write<int,int,int,int,int>
            ((BasicWriter<char> *)in_stack_ffffffffffffff98.data_,in_stack_ffffffffffffffa0,
             (int *)in_stack_ffffffffffffff90.data_,
             (int *)CONCAT17(uVar3,CONCAT16(uVar2,in_stack_ffffffffffffff88)),(int *)in_RDI,args_1,
             (int *)CONCAT44(local_bc,in_stack_ffffffffffffffb0));
  fmt::BasicCStringRef<char>::BasicCStringRef
            ((BasicCStringRef<char> *)&stack0xffffffffffffffa0," {} {}\n");
  fmt::BasicWriter<char>::write<unsigned_long,unsigned_long>
            (this,BVar1,(unsigned_long *)args,(unsigned_long *)args_1_00);
  fmt::BasicCStringRef<char>::BasicCStringRef
            ((BasicCStringRef<char> *)&stack0xffffffffffffff98," {} {}\n");
  fmt::BasicWriter<char>::write<int,int>(this,BVar1,(int *)args,(int *)args_1_00);
  fmt::BasicCStringRef<char>::BasicCStringRef
            ((BasicCStringRef<char> *)&stack0xffffffffffffff90," {} {} {} {} {}\n");
  fmt::BasicWriter<char>::write<int,int,int,int,int>
            ((BasicWriter<char> *)in_stack_ffffffffffffff98.data_,in_stack_ffffffffffffffa0,
             (int *)in_stack_ffffffffffffff90.data_,
             (int *)CONCAT17(uVar3,CONCAT16(uVar2,in_stack_ffffffffffffff88)),(int *)in_RDI,args_1,
             (int *)CONCAT44(local_bc,in_stack_ffffffffffffffb0));
  return local_8;
}

Assistant:

fmt::Writer &mp::operator<<(fmt::Writer &w, const NLHeader &h) {
  w << (h.format == NLHeader::TEXT ? 'g' : 'b') << h.num_ampl_options;
  for (int i = 0; i < h.num_ampl_options; ++i)
    w << ' ' << h.ampl_options[i];
  if (h.ampl_options[USE_VBTOL_OPTION] == READ_VBTOL)
    w << ' ' << h.ampl_vbtol;
  w << '\n';
  w.write(" {} {} {} {} {} {}\n",
      h.num_vars, h.num_algebraic_cons, h.num_objs,
      h.num_ranges, h.num_eqns, h.num_logical_cons);
  w.write(" {} {} {} {} {} {}\n",
      h.num_nl_cons, h.num_nl_objs,
      h.num_compl_conds - h.num_nl_compl_conds,
      h.num_nl_compl_conds, h.num_compl_dbl_ineqs,
      h.num_compl_vars_with_nz_lb);
  w.write(" {} {}\n", h.num_nl_net_cons, h.num_linear_net_cons);
  w.write(" {} {} {}\n",
      h.num_nl_vars_in_cons, h.num_nl_vars_in_objs, h.num_nl_vars_in_both);
  w.write(" {} {} {} {}\n",
      h.num_linear_net_vars, h.num_funcs,
          h.format == NLHeader::TEXT ? 0 : h.arith_kind, h.flags);
  w.write(" {} {} {} {} {}\n",
      h.num_linear_binary_vars, h.num_linear_integer_vars,
      h.num_nl_integer_vars_in_both, h.num_nl_integer_vars_in_cons,
      h.num_nl_integer_vars_in_objs);
  w.write(" {} {}\n", h.num_con_nonzeros, h.num_obj_nonzeros);
  w.write(" {} {}\n", h.max_con_name_len, h.max_var_name_len);
  w.write(" {} {} {} {} {}\n",
      h.num_common_exprs_in_both, h.num_common_exprs_in_cons,
      h.num_common_exprs_in_objs, h.num_common_exprs_in_single_cons,
      h.num_common_exprs_in_single_objs);
  return w;
}